

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

int check_immune(CHAR_DATA *ch,int dam_type)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  if (dam_type == 0) {
    return -1;
  }
  uVar1 = ch->imm_flags[0];
  iVar3 = 1;
  if (dam_type < 4) {
    if (((uVar1 & 8) != 0) || (iVar3 = 2, (ch->res_flags[0] & 8) != 0)) goto LAB_002f70ea;
    uVar2 = 8;
  }
  else {
    if (((uVar1 & 4) != 0) || (iVar3 = 2, (ch->res_flags[0] & 4) != 0)) goto LAB_002f70ea;
    uVar2 = 4;
  }
  iVar3 = (uint)(((uint)ch->vuln_flags[0] & uVar2) != 0) * 3;
LAB_002f70ea:
  if (((uint)dam_type < 0x15) && ((0xb7fffU >> (dam_type - 1U & 0x1f) & 1) != 0)) {
    dVar5 = *(double *)(&DAT_003de498 + (long)(int)(dam_type - 1U) * 8);
    dVar4 = exp2(dVar5);
    if ((uVar1 & (long)dVar4) == 0) {
      uVar1 = ch->res_flags[0];
      dVar4 = exp2(dVar5);
      if ((uVar1 & (long)dVar4) == 0) {
        uVar1 = ch->vuln_flags[0];
        dVar5 = exp2(dVar5);
        if (((long)dVar5 & uVar1) != 0) {
          iVar3 = 3;
        }
      }
      else {
        iVar3 = 2;
      }
    }
    else {
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int check_immune(CHAR_DATA *ch, int dam_type)
{
	int immune, def;
	int bit;

	immune = -1;
	def = IS_NORMAL;

	if (dam_type == DAM_NONE)
		return immune;

	if (dam_type <= 3)
	{
		if (IS_SET(ch->imm_flags, IMM_WEAPON))
			def = IS_IMMUNE;
		else if (IS_SET(ch->res_flags, RES_WEAPON))
			def = IS_RESISTANT;
		else if (IS_SET(ch->vuln_flags, VULN_WEAPON))
			def = IS_VULNERABLE;
	}
	else /* magical attack */
	{
		if (IS_SET(ch->imm_flags, IMM_MAGIC))
			def = IS_IMMUNE;
		else if (IS_SET(ch->res_flags, RES_MAGIC))
			def = IS_RESISTANT;
		else if (IS_SET(ch->vuln_flags, VULN_MAGIC))
			def = IS_VULNERABLE;
	}

	/* set bits to check -- VULN etc. must ALL be the same or this will fail */
	switch (dam_type)
	{
		case DAM_BASH:
			bit = IMM_BASH;
			break;
		case DAM_PIERCE:
			bit = IMM_PIERCE;
			break;
		case DAM_SLASH:
			bit = IMM_SLASH;
			break;
		case DAM_FIRE:
			bit = IMM_FIRE;
			break;
		case DAM_COLD:
			bit = IMM_COLD;
			break;
		case DAM_LIGHTNING:
			bit = IMM_LIGHTNING;
			break;
		case DAM_ACID:
			bit = IMM_ACID;
			break;
		case DAM_POISON:
			bit = IMM_POISON;
			break;
		case DAM_NEGATIVE:
			bit = IMM_NEGATIVE;
			break;
		case DAM_HOLY:
			bit = IMM_HOLY;
			break;
		case DAM_ENERGY:
			bit = IMM_ENERGY;
			break;
		case DAM_MENTAL:
			bit = IMM_MENTAL;
			break;
		case DAM_DISEASE:
			bit = IMM_DISEASE;
			break;
		case DAM_DROWNING:
			bit = IMM_DROWNING;
			break;
		case DAM_LIGHT:
			bit = IMM_LIGHT;
			break;
		case DAM_CHARM:
			bit = IMM_CHARM;
			break;
		case DAM_SOUND:
			bit = IMM_SOUND;
			break;
		case DAM_INTERNAL:
			bit = IMM_INTERNAL;
			break;
		default:
			return def;
	}

	if (IS_SET(ch->imm_flags, bit))
	{
		immune = IS_IMMUNE;
	}
	else if (IS_SET(ch->res_flags, bit) && immune != IS_IMMUNE)
	{
		immune = IS_RESISTANT;
	}
	else if (IS_SET(ch->vuln_flags, bit))
	{
		if (immune == IS_IMMUNE)
			immune = IS_RESISTANT;
		else if (immune == IS_RESISTANT)
			immune = IS_NORMAL;
		else
			immune = IS_VULNERABLE;
	}

	if (immune == -1)
		return def;
	else
		return immune;
}